

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddRuneRange(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  bool unaff_retaddr;
  Rune in_stack_00000008;
  Rune in_stack_0000000c;
  undefined7 in_stack_00000010;
  undefined3 in_stack_ffffffffffffffec;
  
  if ((*(int *)(in_RDI + 0x24) == 1) || (*(int *)(in_RDI + 0x24) != 2)) {
    AddRuneRangeUTF8((Compiler *)CONCAT17(foldcase,in_stack_00000010),in_stack_0000000c,
                     in_stack_00000008,unaff_retaddr);
  }
  else {
    AddRuneRangeLatin1((Compiler *)CONCAT44(in_ESI,in_EDX),
                       CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff,2,
                       SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

void Compiler::AddRuneRange(Rune lo, Rune hi, bool foldcase) {
  switch (encoding_) {
    default:
    case kEncodingUTF8:
      AddRuneRangeUTF8(lo, hi, foldcase);
      break;
    case kEncodingLatin1:
      AddRuneRangeLatin1(lo, hi, foldcase);
      break;
  }
}